

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpEnumerator.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::JavascriptRegExpEnumerator::MoveAndGetNext
          (JavascriptRegExpEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  ScriptContext *requestContext;
  JavascriptRegExpConstructor *this_00;
  BOOL BVar1;
  uint uVar2;
  uint32 index;
  JavascriptString *local_20;
  JavascriptString *item;
  
  *propertyId = -1;
  requestContext =
       (((((this->super_JavascriptEnumerator).super_RecyclableObject.type.ptr)->javascriptLibrary).
        ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  local_20 = (JavascriptString *)0x0;
  this_00 = (this->regExpObject).ptr;
  index = this->index + 1;
  this->index = index;
  BVar1 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyName
                    (this_00,index,&local_20,requestContext);
  if (BVar1 == 0) {
    uVar2 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyCount((this->regExpObject).ptr)
    ;
    this->index = uVar2;
    local_20 = (JavascriptString *)0x0;
  }
  else if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  return local_20;
}

Assistant:

JavascriptString * JavascriptRegExpEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        propertyId = Constants::NoProperty;
        ScriptContext* scriptContext = this->GetScriptContext();

        JavascriptString * item = nullptr;
        if (regExpObject->GetSpecialEnumerablePropertyName(++index, &item, scriptContext))
        {
            if (attributes != nullptr)
            {
                *attributes = PropertyEnumerable;
            }
            return item;
        }

        index = regExpObject->GetSpecialEnumerablePropertyCount();
        return nullptr;
    }